

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanohttp.c
# Opt level: O0

int xmlNanoHTTPFetch(char *URL,char *filename,char **contentType)

{
  int iVar1;
  ssize_t sVar2;
  int local_44;
  int local_40;
  int ret;
  int len;
  int fd;
  char *buf;
  void *ctxt;
  char **contentType_local;
  char *filename_local;
  char *URL_local;
  
  buf = (char *)0x0;
  _len = (char *)0x0;
  local_44 = 0;
  if (filename == (char *)0x0) {
    URL_local._4_4_ = -1;
  }
  else {
    ctxt = contentType;
    contentType_local = (char **)filename;
    filename_local = URL;
    buf = (char *)xmlNanoHTTPOpen(URL,contentType);
    if (buf == (char *)0x0) {
      URL_local._4_4_ = -1;
    }
    else {
      iVar1 = strcmp((char *)contentType_local,"-");
      if (iVar1 == 0) {
        ret = 0;
      }
      else {
        ret = open64((char *)contentType_local,0x41,0x1a4);
        if (ret < 0) {
          xmlNanoHTTPClose(buf);
          if ((ctxt != (void *)0x0) && (*ctxt != 0)) {
            (*xmlFree)(*ctxt);
            *(undefined8 *)ctxt = 0;
          }
          return -1;
        }
      }
      xmlNanoHTTPFetchContent(buf,(char **)&len,&local_40);
      if ((0 < local_40) && (sVar2 = write(ret,_len,(long)local_40), sVar2 == -1)) {
        local_44 = -1;
      }
      xmlNanoHTTPClose(buf);
      close(ret);
      URL_local._4_4_ = local_44;
    }
  }
  return URL_local._4_4_;
}

Assistant:

int
xmlNanoHTTPFetch(const char *URL, const char *filename, char **contentType) {
    void *ctxt = NULL;
    char *buf = NULL;
    int fd;
    int len;
    int ret = 0;

    if (filename == NULL) return(-1);
    ctxt = xmlNanoHTTPOpen(URL, contentType);
    if (ctxt == NULL) return(-1);

    if (!strcmp(filename, "-"))
        fd = 0;
    else {
        fd = open(filename, O_CREAT | O_WRONLY, 00644);
	if (fd < 0) {
	    xmlNanoHTTPClose(ctxt);
	    if ((contentType != NULL) && (*contentType != NULL)) {
	        xmlFree(*contentType);
		*contentType = NULL;
	    }
	    return(-1);
	}
    }

    xmlNanoHTTPFetchContent( ctxt, &buf, &len );
    if ( len > 0 ) {
	if (write(fd, buf, len) == -1) {
	    ret = -1;
	}
    }

    xmlNanoHTTPClose(ctxt);
    close(fd);
    return(ret);
}